

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O1

void __thiscall
gmlc::containers::
StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::freeAll(StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this)

{
  long *plVar1;
  bool bVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (this->dataptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
    lVar5 = (long)this->bsize;
    if (0 < lVar5) {
      lVar6 = lVar5 + 1;
      lVar5 = lVar5 * 0x20 + -0x10;
      do {
        plVar1 = *(long **)((long)this->dataptr[this->dataSlotIndex] + lVar5 + -0x10);
        plVar3 = (long *)((long)&(this->dataptr[this->dataSlotIndex]->_M_dataplus)._M_p + lVar5);
        if (plVar3 != plVar1) {
          operator_delete(plVar1,*plVar3 + 1);
        }
        lVar6 = lVar6 + -1;
        lVar5 = lVar5 + -0x20;
      } while (1 < lVar6);
    }
    if (0 < (long)this->dataSlotIndex) {
      operator_delete(this->dataptr[this->dataSlotIndex],0x400);
    }
    lVar5 = (long)this->dataSlotIndex;
    if (0 < (long)this->dataSlotIndex) {
      do {
        lVar6 = lVar5 + -1;
        lVar4 = 0;
        do {
          plVar3 = (long *)(this->dataptr[lVar6][0x1f].field_2._M_local_buf + lVar4);
          plVar1 = *(long **)((long)&this->dataptr[lVar6][0x1f]._M_dataplus._M_p + lVar4);
          if (plVar3 != plVar1) {
            operator_delete(plVar1,*plVar3 + 1);
          }
          lVar4 = lVar4 + -0x20;
        } while (lVar4 != -0x400);
        operator_delete(this->dataptr[lVar6],0x400);
        bVar2 = 1 < lVar5;
        lVar5 = lVar6;
      } while (bVar2);
    }
    if (this->dataSlotIndex == 0) {
      operator_delete(*this->dataptr,0x400);
    }
    if (0 < this->freeIndex) {
      lVar5 = 0;
      do {
        operator_delete(this->freeblocks[lVar5],0x400);
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->freeIndex);
    }
    if (this->freeblocks !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
      operator_delete__(this->freeblocks);
    }
    if (this->dataptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0)
    {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }